

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Block.h
# Opt level: O2

void __thiscall
Eigen::internal::BlockImpl_dense<const_Eigen::Array<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false,_true>::
BlockImpl_dense(BlockImpl_dense<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false,_true>
                *this,Array<double,__1,_1,_0,__1,_1> *xpr,Index startRow,Index startCol,
               Index blockRows,Index blockCols)

{
  MapBase<Eigen::Block<const_Eigen::Array<double,_-1,_1,_0,_-1,_1>,_-1,_1,_false>,_0>::MapBase
            (&this->
              super_MapBase<Eigen::Block<const_Eigen::Array<double,__1,_1,_0,__1,_1>,__1,_1,_false>,_0>
             ,(xpr->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).m_storage.m_data
              + startRow +
                (xpr->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).m_storage.
                m_rows * startCol,blockRows,blockCols);
  this->m_xpr = xpr;
  (this->m_startRow).m_value = startRow;
  variable_if_dynamic<long,_0>::variable_if_dynamic
            ((variable_if_dynamic<long,_0> *)&this->field_0x28,startCol);
  this->m_outerStride =
       (this->m_xpr->super_PlainObjectBase<Eigen::Array<double,__1,_1,_0,__1,_1>_>).m_storage.m_rows
  ;
  return;
}

Assistant:

BlockImpl_dense(XprType& xpr,
          Index startRow, Index startCol,
          Index blockRows, Index blockCols)
      : Base(xpr.data()+xpr.innerStride()*(XprTypeIsRowMajor?startCol:startRow) + xpr.outerStride()*(XprTypeIsRowMajor?startRow:startCol), blockRows, blockCols),
        m_xpr(xpr), m_startRow(startRow), m_startCol(startCol)
    {
      init();
    }